

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  float fVar1;
  int b;
  int g;
  int r;
  float t;
  float local_74;
  ImDrawVert *pIStack_70;
  float d;
  ImDrawVert *vert;
  int col_delta_b;
  int col_delta_g;
  int col_delta_r;
  int col0_b;
  int col0_g;
  int col0_r;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 IStack_38;
  float gradient_inv_length2;
  ImVec2 gradient_extent;
  ImU32 col1_local;
  ImU32 col0_local;
  int vert_end_idx_local;
  int vert_start_idx_local;
  ImDrawList *draw_list_local;
  ImVec2 gradient_p1_local;
  ImVec2 gradient_p0_local;
  
  gradient_extent.x = (float)col1;
  gradient_extent.y = (float)col0;
  draw_list_local = (ImDrawList *)gradient_p1;
  gradient_p1_local = gradient_p0;
  IStack_38 = ::operator-((ImVec2 *)&draw_list_local,&gradient_p1_local);
  fVar1 = ImLengthSqr(&stack0xffffffffffffffc8);
  vert_start._4_4_ = 1.0 / fVar1;
  _col0_g = (draw_list->VtxBuffer).Data + vert_end_idx;
  col0_b = (uint)gradient_extent.y & 0xff;
  col_delta_r = (uint)gradient_extent.y >> 8 & 0xff;
  col_delta_g = (uint)gradient_extent.y >> 0x10 & 0xff;
  col_delta_b = ((uint)gradient_extent.x & 0xff) - col0_b;
  vert._4_4_ = ((uint)gradient_extent.x >> 8 & 0xff) - col_delta_r;
  vert._0_4_ = ((uint)gradient_extent.x >> 0x10 & 0xff) - col_delta_g;
  pIStack_70 = (draw_list->VtxBuffer).Data + vert_start_idx;
  vert_end = pIStack_70;
  for (; pIStack_70 < _col0_g; pIStack_70 = pIStack_70 + 1) {
    _r = ::operator-(&pIStack_70->pos,&gradient_p1_local);
    local_74 = ImDot((ImVec2 *)&r,&stack0xffffffffffffffc8);
    fVar1 = ImClamp<float>(local_74 * vert_start._4_4_,0.0,1.0);
    pIStack_70->col =
         (int)((float)col_delta_b * fVar1 + (float)col0_b) |
         (int)((float)vert._4_4_ * fVar1 + (float)col_delta_r) << 8 |
         (int)((float)(int)vert * fVar1 + (float)col_delta_g) << 0x10 | pIStack_70->col & 0xff000000
    ;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    const int col0_r = (int)(col0 >> IM_COL32_R_SHIFT) & 0xFF;
    const int col0_g = (int)(col0 >> IM_COL32_G_SHIFT) & 0xFF;
    const int col0_b = (int)(col0 >> IM_COL32_B_SHIFT) & 0xFF;
    const int col_delta_r = ((int)(col1 >> IM_COL32_R_SHIFT) & 0xFF) - col0_r;
    const int col_delta_g = ((int)(col1 >> IM_COL32_G_SHIFT) & 0xFF) - col0_g;
    const int col_delta_b = ((int)(col1 >> IM_COL32_B_SHIFT) & 0xFF) - col0_b;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = (int)(col0_r + col_delta_r * t);
        int g = (int)(col0_g + col_delta_g * t);
        int b = (int)(col0_b + col_delta_b * t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}